

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void cm_wake_any_pending_write(CMConnection conn)

{
  FILE *pFVar1;
  CMControlList p_Var2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  timespec ts;
  CMConnHandlerListEntry callbacks [16];
  timespec local_138;
  timespec local_128 [16];
  
  if (conn->write_callbacks == (CMConnHandlerList)0x0) {
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
      if (iVar3 == 0) goto LAB_0011f8f7;
    }
    else if (CMtrace_val[5] == 0) goto LAB_0011f8f7;
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      _Var4 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,local_128);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_128[0].tv_sec,
              local_128[0].tv_nsec);
    }
    fwrite("Completed pending write, No notifications\n",0x2a,1,(FILE *)conn->cm->CMTrace_file);
  }
  else {
    uVar7 = conn->write_callback_len;
    if (0x10 < uVar7) {
      __assert_fail("conn->write_callback_len <= 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xb62,"void cm_wake_any_pending_write(CMConnection)");
    }
    memcpy(local_128,conn->write_callbacks,uVar7 << 4);
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      plVar8 = &local_128[0].tv_nsec;
      uVar6 = uVar7;
      do {
        if ((code *)((timespec *)(plVar8 + -1))->tv_sec != (code *)0x0) {
          (*(code *)((timespec *)(plVar8 + -1))->tv_sec)(conn->cm,conn,*plVar8);
        }
        plVar8 = plVar8 + 2;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    iVar3 = CMtrace_val[5];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)conn->cm->CMTrace_file;
        _Var4 = getpid();
        pVar5 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_138);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_138.tv_sec,local_138.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"Completed pending write, did %d notifications\n",
              uVar7 & 0xffffffff);
    }
  }
LAB_0011f8f7:
  fflush((FILE *)conn->cm->CMTrace_file);
  p_Var2 = conn->cm->control_list;
  (*p_Var2->wake_select)(&CMstatic_trans_svcs,&p_Var2->select_data);
  return;
}

Assistant:

static void
 cm_wake_any_pending_write(CMConnection conn)
 {
     if (conn->write_callbacks) {
	 int i = 0;
	 CMConnHandlerListEntry callbacks[16];
	 size_t callback_len = conn->write_callback_len;
	 assert(conn->write_callback_len <= 16);
	 memcpy(callbacks, conn->write_callbacks, sizeof(callbacks[0]) * conn->write_callback_len);
	 for (i = 0; i < callback_len; ++i) {
	     if (callbacks[i].func) {
		 (callbacks[i].func)(conn->cm, conn, callbacks[i].client_data);
	     }
	 }
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, did %d notifications\n", i);
     } else {
	 CMtrace_out(conn->cm, CMTransportVerbose, "Completed pending write, No notifications\n");
     }
     CMwake_server_thread(conn->cm);
 }